

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLevelSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,Vec3 *coord,Vec4 *result)

{
  int iVar1;
  int c;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int i;
  int iVar5;
  int iVar6;
  TextureChannelClass TVar7;
  int iVar8;
  int iVar9;
  int x0;
  int x1;
  int y0;
  int y1;
  int z;
  int z_00;
  int c_00;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int c_01;
  bool bVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [12];
  bool local_2cb;
  float local_2a8;
  undefined1 local_258 [16];
  Vector<float,_4> res_3;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_4;
  Vec4 c1;
  Vec4 c0;
  Vector<float,_4> res_8;
  Vector<float,_4> res_9;
  Vector<float,_4> res_5;
  Vector<float,_4> res_6;
  Vector<float,_4> res_2;
  Vec2 local_118;
  Vec2 wBounds;
  Vec2 vBounds;
  Vec2 uBounds;
  ColorQuad quad1;
  ColorQuad quad0;
  Vector<float,_4> res_19;
  
  if (filterMode == LINEAR) {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&uBounds,sampler->normalizedCoords,(level->m_size).m_data[0],
               coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&vBounds,sampler->normalizedCoords,(level->m_size).m_data[1],
               coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&wBounds,sampler->normalizedCoords,(level->m_size).m_data[2],
               coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
    fVar19 = floorf(uBounds.m_data[0] + -0.5);
    fVar20 = floorf(uBounds.m_data[1] + -0.5);
    fVar21 = floorf(vBounds.m_data[0] + -0.5);
    fVar22 = floorf(vBounds.m_data[1] + -0.5);
    fVar23 = floorf(wBounds.m_data[0] + -0.5);
    iVar5 = (int)fVar23;
    fVar23 = floorf(wBounds.m_data[1] + -0.5);
    iVar6 = (int)fVar23;
    iVar8 = (level->m_size).m_data[0];
    iVar1 = (level->m_size).m_data[1];
    iVar18 = (level->m_size).m_data[2];
    TVar7 = getTextureChannelClass((level->m_format).type);
    if (TVar7 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_2a8 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_2a8 = 0.0;
      if (TVar7 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        local_2a8 = computeBilinearSearchStepForUnorm(prec);
      }
    }
    local_2cb = iVar5 <= iVar6;
    if (iVar5 <= iVar6) {
      iVar9 = (int)fVar19;
      iVar13 = (int)fVar20;
      iVar15 = (int)fVar21;
      iVar16 = (int)fVar22;
      local_2cb = true;
      do {
        bVar2 = iVar16 < iVar15;
        if (iVar15 <= iVar16) {
          bVar2 = false;
          c_00 = iVar15;
          do {
            bVar12 = iVar13 < iVar9;
            if (iVar9 <= iVar13) {
              bVar12 = false;
              c = iVar9;
              do {
                x0 = TexVerifierUtil::wrap(sampler->wrapS,c,iVar8);
                c_01 = c + 1;
                x1 = TexVerifierUtil::wrap(sampler->wrapS,c_01,iVar8);
                y0 = TexVerifierUtil::wrap(sampler->wrapT,c_00,iVar1);
                y1 = TexVerifierUtil::wrap(sampler->wrapT,c_00 + 1,iVar1);
                z = TexVerifierUtil::wrap(sampler->wrapR,iVar5,iVar18);
                z_00 = TexVerifierUtil::wrap(sampler->wrapR,iVar5 + 1,iVar18);
                fVar19 = uBounds.m_data[0] + -0.5;
                fVar27 = uBounds.m_data[1] + -0.5;
                fVar20 = vBounds.m_data[0] + -0.5;
                fVar21 = vBounds.m_data[1] + -0.5;
                fVar22 = wBounds.m_data[0] + -0.5;
                fVar23 = wBounds.m_data[1] + -0.5;
                quad0.p11.m_data[0] = 0.0;
                quad0.p11.m_data[1] = 0.0;
                quad0.p11.m_data[2] = 0.0;
                quad0.p11.m_data[3] = 0.0;
                quad0.p10.m_data[0] = 0.0;
                quad0.p10.m_data[1] = 0.0;
                quad0.p10.m_data[2] = 0.0;
                quad0.p10.m_data[3] = 0.0;
                quad0.p01.m_data[0] = 0.0;
                quad0.p01.m_data[1] = 0.0;
                quad0.p01.m_data[2] = 0.0;
                quad0.p01.m_data[3] = 0.0;
                quad0.p00.m_data[0] = 0.0;
                quad0.p00.m_data[1] = 0.0;
                quad0.p00.m_data[2] = 0.0;
                quad0.p00.m_data[3] = 0.0;
                quad1.p11.m_data[0] = 0.0;
                quad1.p11.m_data[1] = 0.0;
                quad1.p11.m_data[2] = 0.0;
                quad1.p11.m_data[3] = 0.0;
                quad1.p10.m_data[0] = 0.0;
                quad1.p10.m_data[1] = 0.0;
                quad1.p10.m_data[2] = 0.0;
                quad1.p10.m_data[3] = 0.0;
                quad1.p01.m_data[0] = 0.0;
                quad1.p01.m_data[1] = 0.0;
                quad1.p01.m_data[2] = 0.0;
                quad1.p01.m_data[3] = 0.0;
                quad1.p00.m_data[0] = 0.0;
                quad1.p00.m_data[1] = 0.0;
                quad1.p00.m_data[2] = 0.0;
                quad1.p00.m_data[3] = 0.0;
                lookupQuad(&quad0,level,sampler,x0,x1,y0,y1,z);
                lookupQuad(&quad1,level,sampler,x0,x1,y0,y1,z_00);
                if (TVar7 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                  fVar24 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
                  fVar25 = computeBilinearSearchStepFromFloatQuad(prec,&quad1);
                  local_2a8 = (float)(~-(uint)(fVar24 <= fVar25) & (uint)fVar25 |
                                     (uint)fVar24 & -(uint)(fVar24 <= fVar25));
                }
                fVar22 = fVar22 - (float)iVar5;
                local_118.m_data[0] = 1.0;
                if (fVar22 <= 1.0) {
                  local_118.m_data[0] = fVar22;
                }
                local_118.m_data[0] = (float)(~-(uint)(fVar22 < 0.0) & (uint)local_118.m_data[0]);
                fVar23 = fVar23 - (float)iVar5;
                local_118.m_data[1] = 1.0;
                if (fVar23 <= 1.0) {
                  local_118.m_data[1] = fVar23;
                }
                local_118.m_data[1] = (float)(~-(uint)(fVar23 < 0.0) & (uint)local_118.m_data[1]);
                bVar3 = isInColorBounds(prec,&quad0,&quad1,result);
                if (bVar3) {
                  fVar19 = fVar19 - (float)c;
                  auVar29 = ZEXT812(0x3f800000);
                  if (fVar19 <= 1.0) {
                    auVar29._4_8_ = 0;
                    auVar29._0_4_ = fVar19;
                  }
                  fVar22 = (float)(~-(uint)(fVar19 < 0.0) & auVar29._0_4_);
                  fVar27 = fVar27 - (float)c;
                  fVar19 = 1.0;
                  if (fVar27 <= 1.0) {
                    fVar19 = fVar27;
                  }
                  fVar19 = (float)(~-(uint)(fVar27 < 0.0) & (uint)fVar19);
                  fVar23 = fVar19 + local_2a8;
                  local_258._4_4_ = 0;
                  local_258._0_4_ = fVar22;
                  local_258._8_4_ = auVar29._8_4_;
                  local_258._12_4_ = 0;
                  bVar3 = fVar22 < fVar23;
                  if (fVar22 < fVar23) {
                    fVar20 = fVar20 - (float)c_00;
                    fVar22 = 1.0;
                    if (fVar20 <= 1.0) {
                      fVar22 = fVar20;
                    }
                    fVar22 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar22);
                    fVar21 = fVar21 - (float)c_00;
                    fVar20 = 1.0;
                    if (fVar21 <= 1.0) {
                      fVar20 = fVar21;
                    }
                    fVar20 = (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar20);
                    fVar21 = fVar20 + local_2a8;
                    bVar3 = true;
                    do {
                      if (fVar22 < fVar21) {
                        fVar24 = (float)(~-(uint)((float)local_258._0_4_ <= fVar19) & (uint)fVar19 |
                                        -(uint)((float)local_258._0_4_ <= fVar19) & local_258._0_4_)
                        ;
                        fVar25 = 1.0 - fVar24;
                        bVar17 = false;
                        fVar27 = fVar22;
                        do {
                          res.m_data[0] = 0.0;
                          res.m_data[1] = 0.0;
                          res.m_data[2] = 0.0;
                          res.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res.m_data[lVar11] = quad0.p00.m_data[lVar11] * fVar25;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          fVar26 = (float)(~-(uint)(fVar27 <= fVar20) & (uint)fVar20 |
                                          -(uint)(fVar27 <= fVar20) & (uint)fVar27);
                          fVar28 = 1.0 - fVar26;
                          res_1.m_data[0] = 0.0;
                          res_1.m_data[1] = 0.0;
                          res_1.m_data[2] = 0.0;
                          res_1.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_1.m_data[lVar11] = res.m_data[lVar11] * fVar28;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_2.m_data[0] = 0.0;
                          res_2.m_data[1] = 0.0;
                          res_2.m_data[2] = 0.0;
                          res_2.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_2.m_data[lVar11] = quad0.p10.m_data[lVar11] * fVar24;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_3.m_data[0] = 0.0;
                          res_3.m_data[1] = 0.0;
                          res_3.m_data[2] = 0.0;
                          res_3.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_3.m_data[lVar11] = res_2.m_data[lVar11] * fVar28;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_4.m_data[0] = 0.0;
                          res_4.m_data[1] = 0.0;
                          res_4.m_data[2] = 0.0;
                          res_4.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_4.m_data[lVar11] = res_1.m_data[lVar11] + res_3.m_data[lVar11];
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_5.m_data[0] = 0.0;
                          res_5.m_data[1] = 0.0;
                          res_5.m_data[2] = 0.0;
                          res_5.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_5.m_data[lVar11] = quad0.p01.m_data[lVar11] * fVar25;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_6.m_data[0] = 0.0;
                          res_6.m_data[1] = 0.0;
                          res_6.m_data[2] = 0.0;
                          res_6.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_6.m_data[lVar11] = res_5.m_data[lVar11] * fVar26;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          c1.m_data[0] = 0.0;
                          c1.m_data[1] = 0.0;
                          c1.m_data[2] = 0.0;
                          c1.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            c1.m_data[lVar11] = res_4.m_data[lVar11] + res_6.m_data[lVar11];
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_8.m_data[0] = 0.0;
                          res_8.m_data[1] = 0.0;
                          res_8.m_data[2] = 0.0;
                          res_8.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_8.m_data[lVar11] = quad0.p11.m_data[lVar11] * fVar24;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_9.m_data[0] = 0.0;
                          res_9.m_data[1] = 0.0;
                          res_9.m_data[2] = 0.0;
                          res_9.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_9.m_data[lVar11] = res_8.m_data[lVar11] * fVar26;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          c0.m_data[0] = 0.0;
                          c0.m_data[1] = 0.0;
                          c0.m_data[2] = 0.0;
                          c0.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            c0.m_data[lVar11] = c1.m_data[lVar11] + res_9.m_data[lVar11];
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_3.m_data[0] = 0.0;
                          res_3.m_data[1] = 0.0;
                          res_3.m_data[2] = 0.0;
                          res_3.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_3.m_data[lVar11] = quad1.p00.m_data[lVar11] * fVar25;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res.m_data[0] = 0.0;
                          res.m_data[1] = 0.0;
                          res.m_data[2] = 0.0;
                          res.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res.m_data[lVar11] = res_3.m_data[lVar11] * fVar28;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_6.m_data[0] = 0.0;
                          res_6.m_data[1] = 0.0;
                          res_6.m_data[2] = 0.0;
                          res_6.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_6.m_data[lVar11] = quad1.p10.m_data[lVar11] * fVar24;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_2.m_data[0] = 0.0;
                          res_2.m_data[1] = 0.0;
                          res_2.m_data[2] = 0.0;
                          res_2.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_2.m_data[lVar11] = res_6.m_data[lVar11] * fVar28;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_1.m_data[0] = 0.0;
                          res_1.m_data[1] = 0.0;
                          res_1.m_data[2] = 0.0;
                          res_1.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_1.m_data[lVar11] = res.m_data[lVar11] + res_2.m_data[lVar11];
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_9.m_data[0] = 0.0;
                          res_9.m_data[1] = 0.0;
                          res_9.m_data[2] = 0.0;
                          res_9.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_9.m_data[lVar11] = quad1.p01.m_data[lVar11] * fVar25;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_5.m_data[0] = 0.0;
                          res_5.m_data[1] = 0.0;
                          res_5.m_data[2] = 0.0;
                          res_5.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_5.m_data[lVar11] = res_9.m_data[lVar11] * fVar26;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_4.m_data[0] = 0.0;
                          res_4.m_data[1] = 0.0;
                          res_4.m_data[2] = 0.0;
                          res_4.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_4.m_data[lVar11] = res_1.m_data[lVar11] + res_5.m_data[lVar11];
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_19.m_data[0] = 0.0;
                          res_19.m_data[1] = 0.0;
                          res_19.m_data[2] = 0.0;
                          res_19.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_19.m_data[lVar11] = quad1.p11.m_data[lVar11] * fVar24;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          res_8.m_data[0] = 0.0;
                          res_8.m_data[1] = 0.0;
                          res_8.m_data[2] = 0.0;
                          res_8.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            res_8.m_data[lVar11] = res_19.m_data[lVar11] * fVar26;
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          c1.m_data[0] = 0.0;
                          c1.m_data[1] = 0.0;
                          c1.m_data[2] = 0.0;
                          c1.m_data[3] = 0.0;
                          lVar11 = 0;
                          do {
                            c1.m_data[lVar11] = res_4.m_data[lVar11] + res_8.m_data[lVar11];
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 4);
                          bVar4 = isLinearRangeValid(prec,&c0,&c1,&local_118,result);
                          if (bVar4) {
                            if (!bVar17) goto LAB_00601c25;
                            break;
                          }
                          fVar27 = fVar27 + local_2a8;
                          bVar17 = fVar21 <= fVar27;
                        } while (fVar27 < fVar21);
                      }
                      local_258._0_4_ = (float)local_258._0_4_ + local_2a8;
                      bVar3 = (float)local_258._0_4_ < fVar23;
                    } while ((float)local_258._0_4_ < fVar23);
                  }
LAB_00601c25:
                  if (bVar3) break;
                }
                bVar12 = iVar13 < c_01;
                c = c_01;
              } while (c_01 <= iVar13);
            }
            if (!bVar12) break;
            c_00 = c_00 + 1;
            bVar2 = iVar16 < c_00;
          } while (c_00 <= iVar16);
        }
        if (!bVar2) {
          return local_2cb;
        }
        iVar5 = iVar5 + 1;
        local_2cb = iVar5 <= iVar6;
      } while (iVar5 <= iVar6);
    }
  }
  else {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&c1,sampler->normalizedCoords,(level->m_size).m_data[0],
               coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&res_4,sampler->normalizedCoords,(level->m_size).m_data[1],
               coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&res_1,sampler->normalizedCoords,(level->m_size).m_data[2],
               coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
    fVar19 = floorf(c1.m_data[0]);
    fVar20 = floorf(c1.m_data[1]);
    fVar21 = floorf(res_4.m_data[0]);
    fVar22 = floorf(res_4.m_data[1]);
    fVar23 = floorf(res_1.m_data[0]);
    local_2a8 = (float)(int)fVar23;
    fVar23 = floorf(res_1.m_data[1]);
    iVar8 = (int)fVar23;
    local_2cb = (int)local_2a8 <= iVar8;
    if ((int)local_2a8 <= iVar8) {
      local_2cb = true;
      iVar1 = (int)fVar21;
      do {
        for (; iVar1 <= (int)fVar22; iVar1 = iVar1 + 1) {
          for (iVar18 = (int)fVar19; iVar18 <= (int)fVar20; iVar18 = iVar18 + 1) {
            iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar18,(level->m_size).m_data[0]);
            iVar5 = TexVerifierUtil::wrap(sampler->wrapT,iVar1,(level->m_size).m_data[1]);
            iVar9 = TexVerifierUtil::wrap(sampler->wrapR,(int)local_2a8,(level->m_size).m_data[2]);
            if ((((iVar6 < 0) || ((level->m_size).m_data[0] <= iVar6)) || (iVar5 < 0)) ||
               ((((level->m_size).m_data[1] <= iVar5 || (iVar9 < 0)) ||
                ((level->m_size).m_data[2] <= iVar9)))) {
              sampleTextureBorder<float>((tcu *)&c0,&level->m_format,sampler);
            }
            else {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&quad0,(int)level,iVar6,iVar5);
              bVar2 = isSRGB(level->m_format);
              if (bVar2) {
                sRGBToLinear((tcu *)&c0,&quad0.p00);
              }
              else {
                c0.m_data[0] = quad0.p00.m_data[0];
                c0.m_data[1] = quad0.p00.m_data[1];
                c0.m_data[2] = quad0.p00.m_data[2];
                c0.m_data[3] = quad0.p00.m_data[3];
              }
            }
            quad1.p00.m_data[0] = 0.0;
            quad1.p00.m_data[1] = 0.0;
            quad1.p00.m_data[2] = 0.0;
            quad1.p00.m_data[3] = 0.0;
            lVar11 = 0;
            do {
              quad1.p00.m_data[lVar11] = c0.m_data[lVar11] - result->m_data[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            quad0.p00.m_data[0] = 0.0;
            quad0.p00.m_data[1] = 0.0;
            quad0.p00.m_data[2] = 0.0;
            quad0.p00.m_data[3] = 0.0;
            lVar11 = 0;
            do {
              fVar23 = quad1.p00.m_data[lVar11];
              fVar27 = -fVar23;
              if (-fVar23 <= fVar23) {
                fVar27 = fVar23;
              }
              quad0.p00.m_data[lVar11] = fVar27;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            res.m_data._0_8_ = res.m_data._0_8_ & 0xffffffff00000000;
            lVar11 = 0;
            do {
              *(bool *)((long)res.m_data + lVar11) =
                   quad0.p00.m_data[lVar11] <= (prec->colorThreshold).m_data[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            res_3.m_data._0_8_ = res_3.m_data._0_8_ & 0xffffffff00000000;
            lVar11 = 0;
            do {
              *(byte *)((long)res_3.m_data + lVar11) = (prec->colorMask).m_data[lVar11] ^ 1;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            quad1.p00.m_data._0_8_ = quad1.p00.m_data._0_8_ & 0xffffffff00000000;
            lVar11 = 0;
            do {
              *(byte *)((long)quad1.p00.m_data + lVar11) =
                   *(byte *)((long)res_3.m_data + lVar11) | *(byte *)((long)res.m_data + lVar11);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            if (quad1.p00.m_data[0]._0_1_ != '\0') {
              uVar10 = 0xffffffffffffffff;
              do {
                if (uVar10 == 2) {
                  uVar14 = 3;
                  break;
                }
                uVar14 = uVar10 + 1;
                lVar11 = uVar10 + 2;
                uVar10 = uVar14;
              } while (*(char *)((long)quad1.p00.m_data + lVar11) != '\0');
              if (2 < uVar14) {
                if (iVar1 <= (int)fVar22) {
                  return local_2cb;
                }
                goto LAB_006012db;
              }
            }
          }
        }
LAB_006012db:
        local_2a8 = (float)((int)local_2a8 + 1);
        local_2cb = (int)local_2a8 <= iVar8;
        iVar1 = (int)fVar21;
      } while ((int)local_2a8 <= iVar8);
    }
  }
  return local_2cb;
}

Assistant:

static bool isLevelSampleResultValid (const ConstPixelBufferAccess&		level,
									  const Sampler&					sampler,
									  const Sampler::FilterMode			filterMode,
									  const LookupPrecision&			prec,
									  const Vec3&						coord,
									  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
		return isLinearSampleResultValid(level, sampler, prec, coord, result);
	else
		return isNearestSampleResultValid(level, sampler, prec, coord, result);
}